

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::CommonFunctionCase::CommonFunctionCase
          (CommonFunctionCase *this,Context *context,char *name,char *description,
          ShaderType shaderType)

{
  ShaderType shaderType_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  CommonFunctionCase *this_local;
  
  gles3::TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__CommonFunctionCase_032b0028;
  this->m_shaderType = shaderType;
  deqp::gls::ShaderExecUtil::ShaderSpec::ShaderSpec(&this->m_spec);
  this->m_numValues = 100;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_failMsg);
  this->m_executor = (ShaderExecutor *)0x0;
  (this->m_spec).version = GLSL_VERSION_300_ES;
  return;
}

Assistant:

CommonFunctionCase::CommonFunctionCase (Context& context, const char* name, const char* description, glu::ShaderType shaderType)
	: TestCase		(context, name, description)
	, m_shaderType	(shaderType)
	, m_numValues	(100)
	, m_executor	(DE_NULL)
{
	m_spec.version = glu::GLSL_VERSION_300_ES;
}